

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  longlong lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  longlong lVar12;
  ulong uVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  int6 iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ushort uVar77;
  short sVar78;
  short sVar79;
  int iVar80;
  int iVar81;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  uint uVar82;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  __m128i *array;
  int32_t in_R9D;
  ushort uVar83;
  ushort uVar84;
  short sVar85;
  ushort uVar107;
  ulong uVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  ushort uVar99;
  ushort uVar100;
  short sVar101;
  short sVar102;
  ushort uVar103;
  ushort uVar104;
  short sVar105;
  short sVar106;
  ushort uVar108;
  short sVar109;
  short sVar110;
  ushort uVar111;
  short sVar112;
  short sVar113;
  ushort uVar115;
  short sVar116;
  short sVar117;
  ushort uVar118;
  ushort uVar119;
  short sVar120;
  short sVar121;
  ushort uVar122;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ushort uVar123;
  ulong uVar114;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  ushort uVar124;
  short sVar125;
  short sVar126;
  ushort uVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  __m128i a;
  __m128i alVar130;
  __m128i alVar131;
  __m128i alVar132;
  __m128i alVar133;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  int32_t in_stack_ffffffffffffe9a8;
  int32_t temp;
  int32_t column_len;
  int16_t *l;
  int16_t *s;
  int16_t *m;
  int16_t *t;
  __m128i vCompare;
  __m128i cond_max;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case0;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vMaxHUnit;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_1290;
  int16_t local_128e;
  int16_t local_128c;
  ushort local_128a;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m128i vOne;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_c08;
  short sStack_c06;
  short sStack_c04;
  short sStack_c02;
  short sStack_c00;
  short sStack_bfe;
  short sStack_bfc;
  short sStack_bfa;
  short local_bf8;
  short sStack_bf6;
  short sStack_bf4;
  short sStack_bf2;
  short sStack_bf0;
  short sStack_bee;
  short sStack_bec;
  short sStack_bea;
  short local_bd8;
  short sStack_bd6;
  short sStack_bd4;
  short sStack_bd2;
  short sStack_bd0;
  short sStack_bce;
  short sStack_bcc;
  short sStack_bca;
  short sStack_b96;
  short sStack_b94;
  short sStack_b92;
  short sStack_b90;
  short sStack_b8e;
  short sStack_b8c;
  short sStack_b8a;
  short local_b88;
  short sStack_b86;
  short sStack_b84;
  short sStack_b82;
  short sStack_b80;
  short sStack_b7e;
  short sStack_b7c;
  short sStack_b7a;
  short local_b78;
  short sStack_b76;
  short sStack_b74;
  short sStack_b72;
  short sStack_b70;
  short sStack_b6e;
  short sStack_b6c;
  short sStack_b6a;
  short local_b68;
  short sStack_b66;
  short sStack_b64;
  short sStack_b62;
  short sStack_b60;
  short sStack_b5e;
  short sStack_b5c;
  short sStack_b5a;
  short local_b48;
  short sStack_b46;
  short sStack_b44;
  short sStack_b42;
  short sStack_b40;
  short sStack_b3e;
  short sStack_b3c;
  short sStack_b3a;
  short local_b38;
  short sStack_b36;
  short sStack_b34;
  short sStack_b32;
  short sStack_b30;
  short sStack_b2e;
  short sStack_b2c;
  short sStack_b2a;
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  short sStack_afe;
  short sStack_afc;
  short sStack_afa;
  short local_af8;
  short sStack_af6;
  short sStack_af4;
  short sStack_af2;
  short sStack_af0;
  short sStack_aee;
  short sStack_aec;
  short sStack_aea;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  short local_ab8;
  short sStack_ab6;
  short sStack_ab4;
  short sStack_ab2;
  short sStack_ab0;
  short sStack_aae;
  short sStack_aac;
  short sStack_aaa;
  short local_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  short sStack_a90;
  short sStack_a8e;
  short sStack_a8c;
  short sStack_a8a;
  short local_a78;
  short sStack_a76;
  short sStack_a74;
  short sStack_a72;
  short sStack_a70;
  short sStack_a6e;
  short sStack_a6c;
  short sStack_a6a;
  short local_a48;
  short sStack_a46;
  short sStack_a44;
  short sStack_a42;
  short sStack_a40;
  short sStack_a3e;
  short sStack_a3c;
  short sStack_a3a;
  short local_9f8;
  short sStack_9f6;
  short sStack_9f4;
  short sStack_9f2;
  short sStack_9f0;
  short sStack_9ee;
  short sStack_9ec;
  short sStack_9ea;
  ushort local_9e8;
  ushort uStack_9e6;
  ushort uStack_9e4;
  ushort uStack_9e2;
  ushort uStack_9e0;
  ushort uStack_9de;
  ushort uStack_9dc;
  ushort uStack_9da;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short sStack_920;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_16","profile"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_scan_profile_sse41_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_scan_profile_sse41_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_scan_profile_sse41_128_16",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_scan_profile_sse41_128_16",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_scan_profile_sse41_128_16",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    matrix._4_4_ = 0;
    s1Len = profile->s1Len;
    ppVar3 = profile->matrix;
    iVar80 = (s1Len + 7) / 8;
    pvVar4 = (profile->profile16).score;
    pvVar5 = (profile->profile16).matches;
    pvVar6 = (profile->profile16).similar;
    i._0_2_ = (short)open;
    uVar7 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar10 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (short)gap;
    uVar8 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    uVar11 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    if (ppVar3->min <= -open) {
      i._0_2_ = -(short)ppVar3->min;
    }
    uVar77 = (short)i + 0x8001;
    sVar78 = ((ushort)ppVar3->max ^ 0x7fff) - 1;
    local_128c = 0;
    local_128e = 0;
    local_1290 = 0;
    lVar9 = CONCAT26(uVar77,CONCAT24(uVar77,CONCAT22(uVar77,uVar77)));
    lVar12 = CONCAT26(uVar77,CONCAT24(uVar77,CONCAT22(uVar77,uVar77)));
    vSaturationCheckMax[1] = CONCAT26(sVar78,CONCAT24(sVar78,CONCAT22(sVar78,sVar78)));
    vSaturationCheckMin[0] = CONCAT26(sVar78,CONCAT24(sVar78,CONCAT22(sVar78,sVar78)));
    vMaxM[0] = lVar12;
    vMaxS[1] = lVar9;
    vMaxS[0] = lVar12;
    vMaxL[1] = lVar9;
    vMaxL[0] = lVar12;
    vMaxHUnit[1] = lVar9;
    pvP._0_2_ = (short)iVar80;
    auVar76._2_2_ = (short)pvP;
    auVar76._0_2_ = (short)pvP;
    auVar76._4_2_ = (short)pvP;
    auVar76._10_2_ = (short)pvP;
    auVar76._8_2_ = (short)pvP;
    auVar76._12_2_ = (short)pvP;
    auVar76._6_2_ = (short)pvP;
    sVar79 = -(short)pvP * (short)j;
    auVar94._2_2_ = sVar79;
    auVar94._0_2_ = sVar79;
    auVar94._4_2_ = sVar79;
    auVar94._10_2_ = sVar79;
    auVar94._8_2_ = sVar79;
    auVar94._12_2_ = sVar79;
    auVar94._6_2_ = sVar79;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = CONCAT62(0,uVar77);
    auVar94._14_2_ = 0;
    auVar93 = paddsw(auVar93,auVar94 << 0x10);
    profile_local = (parasail_profile_t *)parasail_result_new_table3(iVar80 * 8,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x8210404;
      uVar82 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar82;
      *(uint *)&profile_local->field_0xc = uVar82;
      b = parasail_memalign___m128i(0x10,(long)iVar80);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar80);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar80);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar80);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar80);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar80);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar80);
      b_06 = parasail_memalign___m128i(0x10,(long)iVar80);
      ptr = parasail_memalign___m128i(0x10,(long)iVar80);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar80);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar80);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar80);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar80);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar80);
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_06 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar130[0] = (long)iVar80;
        alVar130[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar130,len);
        alVar131[0] = (long)iVar80;
        alVar131[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar131,len);
        alVar132[0] = (long)iVar80;
        alVar132[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,alVar132,len);
        alVar133[0] = (long)iVar80;
        alVar133[1] = extraout_RDX_02;
        parasail_memset___m128i(b_06,alVar133,len);
        c[0] = (long)iVar80;
        c[1] = extraout_RDX_03;
        parasail_memset___m128i(b,c,len);
        c_00[0] = (long)iVar80;
        c_00[1] = extraout_RDX_04;
        parasail_memset___m128i(b_00,c_00,len);
        c_01[0] = (long)iVar80;
        c_01[1] = extraout_RDX_05;
        parasail_memset___m128i(b_01,c_01,len);
        c_02[0] = (long)iVar80;
        c_02[1] = extraout_RDX_06;
        array = b_02;
        parasail_memset___m128i(b_02,c_02,len);
        auVar95._8_8_ = uVar10;
        auVar95._0_8_ = uVar7;
        register0x00001200 = psubsw(ZEXT816(0),auVar95);
        vGapperL[0] = 0x1000100010001;
        vE[1] = 0x1000100010001;
        end_query = iVar80;
        while (end_query = end_query + -1, -1 < end_query) {
          ptr_03[end_query][0] = vGapperL[1];
          ptr_03[end_query][1] = vGapper[0];
          ptr_04[end_query][0] = vE[1];
          ptr_04[end_query][1] = vGapperL[0];
          auVar97._8_8_ = uVar11;
          auVar97._0_8_ = uVar8;
          register0x00001200 = psubsw(stack0xffffffffffffec88,auVar97);
          auVar96._8_8_ = 0x1000100010001;
          auVar96._0_8_ = 0x1000100010001;
          register0x00001200 = paddsw(stack0xffffffffffffec78,auVar96);
        }
        vNegInfFront[1] = lVar9;
        vMaxHUnit[0] = lVar12;
        vMaxM[1] = lVar9;
        vMaxH[0] = lVar12;
        vMaxH[1] = lVar9;
        vSaturationCheckMax[0] = lVar12;
        local_128a = uVar77;
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          vH_03[0] = b_03[iVar80 + -1][0];
          uVar86 = b_04[iVar80 + -1][0];
          uVar114 = b_05[iVar80 + -1][0];
          uVar13 = b_06[iVar80 + -1][0];
          vHp[0] = b_03[iVar80 + -1][1] << 0x10 | vH_03[0] >> 0x30;
          vHpM[1] = vH_03[0] << 0x10;
          vHpM[0] = b_04[iVar80 + -1][1] << 0x10 | uVar86 >> 0x30;
          vHpS[1] = uVar86 << 0x10;
          vHpS[0] = b_05[iVar80 + -1][1] << 0x10 | uVar114 >> 0x30;
          vHpL[1] = uVar114 << 0x10;
          vHpL[0] = b_06[iVar80 + -1][1] << 0x10 | uVar13 >> 0x30;
          pvW = (__m128i *)(uVar13 << 0x10);
          iVar81 = ppVar3->mapper[(byte)s2[end_ref]];
          iVar1 = ppVar3->mapper[(byte)s2[end_ref]];
          vH_03[0] = (ulong)end_ref;
          iVar2 = ppVar3->mapper[(byte)s2[vH_03[0]]];
          vHtM[1] = 0;
          vHt[0] = 0;
          vF[0] = lVar12;
          vF_ext[1] = lVar9;
          stack0xffffffffffffeb98 = ZEXT816(0);
          stack0xffffffffffffeb88 = ZEXT816(0);
          stack0xffffffffffffeb78 = ZEXT816(0);
          end_query = 0;
          while( true ) {
            local_928 = (short)vF_ext[1];
            sStack_926 = vF_ext[1]._2_2_;
            sStack_924 = vF_ext[1]._4_2_;
            sStack_922 = vF_ext[1]._6_2_;
            sStack_920 = (short)vF_ext[2];
            sStack_afe = vF_ext[2]._2_2_;
            sStack_afc = vF_ext[2]._4_2_;
            sStack_afa = vF_ext[2]._6_2_;
            if (iVar80 <= end_query) break;
            alVar130 = b_03[end_query];
            alVar131 = b_04[end_query];
            alVar132 = b_05[end_query];
            alVar133 = b_06[end_query];
            auVar31._8_8_ = uVar10;
            auVar31._0_8_ = uVar7;
            auVar94 = psubsw((undefined1  [16])b_03[end_query],auVar31);
            auVar30._8_8_ = uVar11;
            auVar30._0_8_ = uVar8;
            auVar95 = psubsw((undefined1  [16])b[end_query],auVar30);
            local_ae8 = auVar94._0_2_;
            sStack_ae6 = auVar94._2_2_;
            sStack_ae4 = auVar94._4_2_;
            sStack_ae2 = auVar94._6_2_;
            sStack_ae0 = auVar94._8_2_;
            sStack_ade = auVar94._10_2_;
            sStack_adc = auVar94._12_2_;
            sStack_ada = auVar94._14_2_;
            local_af8 = auVar95._0_2_;
            sStack_af6 = auVar95._2_2_;
            sStack_af4 = auVar95._4_2_;
            sStack_af2 = auVar95._6_2_;
            sStack_af0 = auVar95._8_2_;
            sStack_aee = auVar95._10_2_;
            sStack_aec = auVar95._12_2_;
            sStack_aea = auVar95._14_2_;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_af6 < sStack_ae6),-(ushort)(local_af8 < local_ae8));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_af4 < sStack_ae4),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_af2 < sStack_ae2),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_aee < sStack_ade),-(ushort)(sStack_af0 < sStack_ae0));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_aec < sStack_adc),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_aea < sStack_ada),(undefined6)case1[0]);
            uVar83 = (ushort)(local_ae8 < local_af8) * local_af8 |
                     (ushort)(local_ae8 >= local_af8) * local_ae8;
            uVar99 = (ushort)(sStack_ae6 < sStack_af6) * sStack_af6 |
                     (ushort)(sStack_ae6 >= sStack_af6) * sStack_ae6;
            uVar103 = (ushort)(sStack_ae4 < sStack_af4) * sStack_af4 |
                      (ushort)(sStack_ae4 >= sStack_af4) * sStack_ae4;
            uVar107 = (ushort)(sStack_ae2 < sStack_af2) * sStack_af2 |
                      (ushort)(sStack_ae2 >= sStack_af2) * sStack_ae2;
            uVar111 = (ushort)(sStack_ae0 < sStack_af0) * sStack_af0 |
                      (ushort)(sStack_ae0 >= sStack_af0) * sStack_ae0;
            uVar115 = (ushort)(sStack_ade < sStack_aee) * sStack_aee |
                      (ushort)(sStack_ade >= sStack_aee) * sStack_ade;
            uVar119 = (ushort)(sStack_adc < sStack_aec) * sStack_aec |
                      (ushort)(sStack_adc >= sStack_aec) * sStack_adc;
            uVar123 = (ushort)(sStack_ada < sStack_aea) * sStack_aea |
                      (ushort)(sStack_ada >= sStack_aea) * sStack_ada;
            vE_ext[1] = CONCAT26(uVar107,CONCAT24(uVar103,CONCAT22(uVar99,uVar83)));
            vE[0] = CONCAT26(uVar123,CONCAT24(uVar119,CONCAT22(uVar115,uVar111)));
            auVar73._8_8_ = case1[0];
            auVar73._0_8_ = case2[1];
            auVar128 = pblendvb((undefined1  [16])b_00[end_query],(undefined1  [16])b_04[end_query],
                                auVar73);
            auVar72._8_8_ = case1[0];
            auVar72._0_8_ = case2[1];
            auVar129 = pblendvb((undefined1  [16])b_01[end_query],(undefined1  [16])b_05[end_query],
                                auVar72);
            auVar71._8_8_ = case1[0];
            auVar71._0_8_ = case2[1];
            auVar94 = pblendvb((undefined1  [16])b_02[end_query],(undefined1  [16])b_06[end_query],
                               auVar71);
            auVar26._8_8_ = 0x1000100010001;
            auVar26._0_8_ = 0x1000100010001;
            auVar94 = paddsw(auVar94,auVar26);
            auVar25._8_8_ = vHt[0];
            auVar25._0_8_ = vHtM[1];
            auVar95 = paddsw(auVar25,(undefined1  [16])ptr_03[end_query]);
            local_b18 = auVar95._0_2_;
            sStack_b16 = auVar95._2_2_;
            sStack_b14 = auVar95._4_2_;
            sStack_b12 = auVar95._6_2_;
            sStack_b10 = auVar95._8_2_;
            sStack_b0e = auVar95._10_2_;
            sStack_b0c = auVar95._12_2_;
            sStack_b0a = auVar95._14_2_;
            uVar86 = CONCAT26(-(ushort)(sStack_b12 < sStack_922),
                              CONCAT24(-(ushort)(sStack_b14 < sStack_924),
                                       CONCAT22(-(ushort)(sStack_b16 < sStack_926),
                                                -(ushort)(local_b18 < local_928)))) |
                     CONCAT26(-(ushort)(sStack_922 == sStack_b12),
                              CONCAT24(-(ushort)(sStack_924 == sStack_b14),
                                       CONCAT22(-(ushort)(sStack_926 == sStack_b16),
                                                -(ushort)(local_928 == local_b18))));
            uVar114 = CONCAT26(-(ushort)(sStack_b0a < sStack_afa),
                               CONCAT24(-(ushort)(sStack_b0c < sStack_afc),
                                        CONCAT22(-(ushort)(sStack_b0e < sStack_afe),
                                                 -(ushort)(sStack_b10 < sStack_920)))) |
                      CONCAT26(-(ushort)(sStack_afa == sStack_b0a),
                               CONCAT24(-(ushort)(sStack_afc == sStack_b0c),
                                        CONCAT22(-(ushort)(sStack_afe == sStack_b0e),
                                                 -(ushort)(sStack_920 == sStack_b10))));
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_926 < sStack_b16) * sStack_b16 |
                          (ushort)(sStack_926 >= sStack_b16) * sStack_926,
                          (ushort)(local_928 < local_b18) * local_b18 |
                          (ushort)(local_928 >= local_b18) * local_928);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_924 < sStack_b14) * sStack_b14 |
                          (ushort)(sStack_924 >= sStack_b14) * sStack_924,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_922 < sStack_b12) * sStack_b12 |
                                 (ushort)(sStack_922 >= sStack_b12) * sStack_922,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_920 < sStack_b10) * sStack_b10 |
                          (ushort)(sStack_920 >= sStack_b10) * sStack_920;
            vF[0]._2_2_ = (ushort)(sStack_afe < sStack_b0e) * sStack_b0e |
                          (ushort)(sStack_afe >= sStack_b0e) * sStack_afe;
            vF[0]._4_2_ = (ushort)(sStack_afc < sStack_b0c) * sStack_b0c |
                          (ushort)(sStack_afc >= sStack_b0c) * sStack_afc;
            vF[0]._6_2_ = (ushort)(sStack_afa < sStack_b0a) * sStack_b0a |
                          (ushort)(sStack_afa >= sStack_b0a) * sStack_afa;
            auVar70._8_8_ = uVar114;
            auVar70._0_8_ = uVar86;
            register0x00001240 = pblendvb(stack0xffffffffffffebf8,stack0xffffffffffffeb98,auVar70);
            auVar69._8_8_ = uVar114;
            auVar69._0_8_ = uVar86;
            register0x00001240 = pblendvb(stack0xffffffffffffebe8,stack0xffffffffffffeb88,auVar69);
            auVar95 = paddsw(stack0xffffffffffffebd8,(undefined1  [16])ptr_04[end_query]);
            auVar68._8_8_ = uVar114;
            auVar68._0_8_ = uVar86;
            register0x00001240 = pblendvb(auVar95,stack0xffffffffffffeb78,auVar68);
            auVar95 = paddsw((undefined1  [16])stack0xffffffffffffeb28,
                             *(undefined1 (*) [16])
                              ((long)pvVar4 +
                              (long)end_query * 0x10 + (long)(iVar81 * iVar80) * 0x10));
            auVar96 = paddsw((undefined1  [16])stack0xffffffffffffeb18,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)end_query * 0x10 + (long)(iVar1 * iVar80) * 0x10
                              ));
            auVar97 = paddsw((undefined1  [16])stack0xffffffffffffeb08,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)end_query * 0x10 + (long)(iVar2 * iVar80) * 0x10
                              ));
            auVar24._8_8_ = 0x1000100010001;
            auVar24._0_8_ = 0x1000100010001;
            auVar98 = paddsw((undefined1  [16])_pvW,auVar24);
            vHpM[1] = auVar95._0_8_;
            vHp[0] = auVar95._8_8_;
            local_b38 = auVar95._0_2_;
            sStack_b36 = auVar95._2_2_;
            sStack_b34 = auVar95._4_2_;
            sStack_b32 = auVar95._6_2_;
            sStack_b30 = auVar95._8_2_;
            sStack_b2e = auVar95._10_2_;
            sStack_b2c = auVar95._12_2_;
            sStack_b2a = auVar95._14_2_;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_b36 < (short)uVar99),-(ushort)(local_b38 < (short)uVar83)
                         );
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_b34 < (short)uVar103),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_b32 < (short)uVar107),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_b2e < (short)uVar115),
                          -(ushort)(sStack_b30 < (short)uVar111));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_b2c < (short)uVar119),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_b2a < (short)uVar123),(undefined6)case1[0]);
            vHtM[1] = CONCAT26((ushort)((short)uVar107 < sStack_b32) * sStack_b32 |
                               ((short)uVar107 >= sStack_b32) * uVar107,
                               CONCAT24((ushort)((short)uVar103 < sStack_b34) * sStack_b34 |
                                        ((short)uVar103 >= sStack_b34) * uVar103,
                                        CONCAT22((ushort)((short)uVar99 < sStack_b36) * sStack_b36 |
                                                 ((short)uVar99 >= sStack_b36) * uVar99,
                                                 (ushort)((short)uVar83 < local_b38) * local_b38 |
                                                 ((short)uVar83 >= local_b38) * uVar83)));
            vHt[0] = CONCAT26((ushort)((short)uVar123 < sStack_b2a) * sStack_b2a |
                              ((short)uVar123 >= sStack_b2a) * uVar123,
                              CONCAT24((ushort)((short)uVar119 < sStack_b2c) * sStack_b2c |
                                       ((short)uVar119 >= sStack_b2c) * uVar119,
                                       CONCAT22((ushort)((short)uVar115 < sStack_b2e) * sStack_b2e |
                                                ((short)uVar115 >= sStack_b2e) * uVar115,
                                                (ushort)((short)uVar111 < sStack_b30) * sStack_b30 |
                                                ((short)uVar111 >= sStack_b30) * uVar111)));
            vHpS[1] = auVar96._0_8_;
            vHpM[0] = auVar96._8_8_;
            vES[1] = auVar128._0_8_;
            vEM[0] = auVar128._8_8_;
            auVar67._8_8_ = case1[0];
            auVar67._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar96,auVar128,auVar67);
            vHpL[1] = auVar97._0_8_;
            vHpS[0] = auVar97._8_8_;
            vEL[1] = auVar129._0_8_;
            vES[0] = auVar129._8_8_;
            auVar66._8_8_ = case1[0];
            auVar66._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar97,auVar129,auVar66);
            pvW = auVar98._0_8_;
            vHpL[0] = auVar98._8_8_;
            vHt[1] = auVar94._0_8_;
            vEL[0] = auVar94._8_8_;
            auVar65._8_8_ = case1[0];
            auVar65._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar98,auVar94,auVar65);
            b[end_query][0] = vE_ext[1];
            b[end_query][1] = vE[0];
            b_00[end_query][0] = vES[1];
            b_00[end_query][1] = vEM[0];
            b_01[end_query][0] = vEL[1];
            b_01[end_query][1] = vES[0];
            b_02[end_query][0] = vHt[1];
            b_02[end_query][1] = vEL[0];
            b_03[end_query][0] = vHpM[1];
            b_03[end_query][1] = vHp[0];
            b_04[end_query][0] = vHpS[1];
            b_04[end_query][1] = vHpM[0];
            b_05[end_query][0] = vHpL[1];
            b_05[end_query][1] = vHpS[0];
            b_06[end_query][0] = (longlong)pvW;
            b_06[end_query][1] = vHpL[0];
            end_query = end_query + 1;
            _pvW = alVar133;
            unique0x10006b56 = alVar132;
            unique0x10006b76 = alVar131;
            unique0x10006b96 = alVar130;
          }
          lVar87 = vHtS[1] << 0x10;
          vHtM[0] = vHtM[0] << 0x10 | (ulong)vHtS[1] >> 0x30;
          vHtS[1] = lVar87;
          lVar88 = vHtL[1] << 0x10;
          vHtS[0] = vHtS[0] << 0x10 | (ulong)vHtL[1] >> 0x30;
          vHtL[1] = lVar88;
          lVar89 = vF[1] << 0x10;
          vHtL[0] = vHtL[0] << 0x10 | (ulong)vF[1] >> 0x30;
          vF[1] = lVar89;
          auVar128._8_8_ = vHt[0] << 0x10 | (ulong)vHtM[1] >> 0x30;
          auVar128._0_8_ = vHtM[1] << 0x10;
          auVar94 = paddsw(auVar128,(undefined1  [16])*ptr_03);
          local_b48 = auVar94._0_2_;
          sStack_b46 = auVar94._2_2_;
          sStack_b44 = auVar94._4_2_;
          sStack_b42 = auVar94._6_2_;
          sStack_b40 = auVar94._8_2_;
          sStack_b3e = auVar94._10_2_;
          sStack_b3c = auVar94._12_2_;
          sStack_b3a = auVar94._14_2_;
          uVar86 = CONCAT26(-(ushort)(sStack_922 < sStack_b42),
                            CONCAT24(-(ushort)(sStack_924 < sStack_b44),
                                     CONCAT22(-(ushort)(sStack_926 < sStack_b46),
                                              -(ushort)(local_928 < local_b48)))) |
                   CONCAT26(-(ushort)(sStack_b42 == sStack_922),
                            CONCAT24(-(ushort)(sStack_b44 == sStack_924),
                                     CONCAT22(-(ushort)(sStack_b46 == sStack_926),
                                              -(ushort)(local_b48 == local_928))));
          uVar114 = CONCAT26(-(ushort)(sStack_afa < sStack_b3a),
                             CONCAT24(-(ushort)(sStack_afc < sStack_b3c),
                                      CONCAT22(-(ushort)(sStack_afe < sStack_b3e),
                                               -(ushort)(sStack_920 < sStack_b40)))) |
                    CONCAT26(-(ushort)(sStack_b3a == sStack_afa),
                             CONCAT24(-(ushort)(sStack_b3c == sStack_afc),
                                      CONCAT22(-(ushort)(sStack_b3e == sStack_afe),
                                               -(ushort)(sStack_b40 == sStack_920))));
          vF_ext[1]._0_4_ =
               CONCAT22((ushort)(sStack_926 < sStack_b46) * sStack_b46 |
                        (ushort)(sStack_926 >= sStack_b46) * sStack_926,
                        (ushort)(local_928 < local_b48) * local_b48 |
                        (ushort)(local_928 >= local_b48) * local_928);
          vF_ext[1]._0_6_ =
               CONCAT24((ushort)(sStack_924 < sStack_b44) * sStack_b44 |
                        (ushort)(sStack_924 >= sStack_b44) * sStack_924,(undefined4)vF_ext[1]);
          vF_ext[1] = CONCAT26((ushort)(sStack_922 < sStack_b42) * sStack_b42 |
                               (ushort)(sStack_922 >= sStack_b42) * sStack_922,(undefined6)vF_ext[1]
                              );
          vF[0]._0_2_ = (ushort)(sStack_920 < sStack_b40) * sStack_b40 |
                        (ushort)(sStack_920 >= sStack_b40) * sStack_920;
          vF[0]._2_2_ = (ushort)(sStack_afe < sStack_b3e) * sStack_b3e |
                        (ushort)(sStack_afe >= sStack_b3e) * sStack_afe;
          vF[0]._4_2_ = (ushort)(sStack_afc < sStack_b3c) * sStack_b3c |
                        (ushort)(sStack_afc >= sStack_b3c) * sStack_afc;
          vF[0]._6_2_ = (ushort)(sStack_afa < sStack_b3a) * sStack_b3a |
                        (ushort)(sStack_afa >= sStack_b3a) * sStack_afa;
          auVar64._8_8_ = vHtM[0];
          auVar64._0_8_ = lVar87;
          auVar63._8_8_ = uVar114;
          auVar63._0_8_ = uVar86;
          register0x00001240 = pblendvb(stack0xffffffffffffeb98,auVar64,auVar63);
          auVar62._8_8_ = vHtS[0];
          auVar62._0_8_ = lVar88;
          auVar61._8_8_ = uVar114;
          auVar61._0_8_ = uVar86;
          register0x00001240 = pblendvb(stack0xffffffffffffeb88,auVar62,auVar61);
          auVar98._8_8_ = vHtL[0];
          auVar98._0_8_ = lVar89;
          auVar94 = paddsw(auVar98,(undefined1  [16])*ptr_04);
          auVar129._8_8_ = uVar114;
          auVar129._0_8_ = uVar86;
          register0x00001240 = pblendvb(stack0xffffffffffffeb78,auVar94,auVar129);
          end_query = 0;
          while( true ) {
            if (5 < end_query) break;
            auVar23._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            auVar23._0_8_ = vF_ext[1] << 0x10;
            auVar94 = paddsw(auVar23,auVar93);
            local_b68 = auVar94._0_2_;
            sStack_b66 = auVar94._2_2_;
            sStack_b64 = auVar94._4_2_;
            sStack_b62 = auVar94._6_2_;
            sStack_b60 = auVar94._8_2_;
            sStack_b5e = auVar94._10_2_;
            sStack_b5c = auVar94._12_2_;
            sStack_b5a = auVar94._14_2_;
            local_b78 = (short)vF_ext[1];
            sStack_b76 = vF_ext[1]._2_2_;
            sStack_b74 = vF_ext[1]._4_2_;
            sStack_b72 = vF_ext[1]._6_2_;
            sStack_b70 = (short)vF_ext[2];
            sStack_b6e = vF_ext[2]._2_2_;
            sStack_b6c = vF_ext[2]._4_2_;
            sStack_b6a = vF_ext[2]._6_2_;
            uVar86 = CONCAT26(-(ushort)(sStack_b72 < sStack_b62),
                              CONCAT24(-(ushort)(sStack_b74 < sStack_b64),
                                       CONCAT22(-(ushort)(sStack_b76 < sStack_b66),
                                                -(ushort)(local_b78 < local_b68)))) |
                     CONCAT26(-(ushort)(sStack_b62 == sStack_b72),
                              CONCAT24(-(ushort)(sStack_b64 == sStack_b74),
                                       CONCAT22(-(ushort)(sStack_b66 == sStack_b76),
                                                -(ushort)(local_b68 == local_b78))));
            uVar114 = CONCAT26(-(ushort)(sStack_b6a < sStack_b5a),
                               CONCAT24(-(ushort)(sStack_b6c < sStack_b5c),
                                        CONCAT22(-(ushort)(sStack_b6e < sStack_b5e),
                                                 -(ushort)(sStack_b70 < sStack_b60)))) |
                      CONCAT26(-(ushort)(sStack_b5a == sStack_b6a),
                               CONCAT24(-(ushort)(sStack_b5c == sStack_b6c),
                                        CONCAT22(-(ushort)(sStack_b5e == sStack_b6e),
                                                 -(ushort)(sStack_b60 == sStack_b70))));
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_b76 < sStack_b66) * sStack_b66 |
                          (ushort)(sStack_b76 >= sStack_b66) * sStack_b76,
                          (ushort)(local_b78 < local_b68) * local_b68 |
                          (ushort)(local_b78 >= local_b68) * local_b78);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_b74 < sStack_b64) * sStack_b64 |
                          (ushort)(sStack_b74 >= sStack_b64) * sStack_b74,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_b72 < sStack_b62) * sStack_b62 |
                                 (ushort)(sStack_b72 >= sStack_b62) * sStack_b72,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_b70 < sStack_b60) * sStack_b60 |
                          (ushort)(sStack_b70 >= sStack_b60) * sStack_b70;
            vF[0]._2_2_ = (ushort)(sStack_b6e < sStack_b5e) * sStack_b5e |
                          (ushort)(sStack_b6e >= sStack_b5e) * sStack_b6e;
            vF[0]._4_2_ = (ushort)(sStack_b6c < sStack_b5c) * sStack_b5c |
                          (ushort)(sStack_b6c >= sStack_b5c) * sStack_b6c;
            vF[0]._6_2_ = (ushort)(sStack_b6a < sStack_b5a) * sStack_b5a |
                          (ushort)(sStack_b6a >= sStack_b5a) * sStack_b6a;
            auVar60._8_8_ = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
            auVar60._0_8_ = vFS[1] << 0x10;
            auVar59._8_8_ = uVar114;
            auVar59._0_8_ = uVar86;
            register0x00001240 = pblendvb(stack0xffffffffffffeb98,auVar60,auVar59);
            auVar58._8_8_ = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
            auVar58._0_8_ = vFL[1] << 0x10;
            auVar57._8_8_ = uVar114;
            auVar57._0_8_ = uVar86;
            register0x00001240 = pblendvb(stack0xffffffffffffeb88,auVar58,auVar57);
            auVar22._8_8_ = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
            auVar22._0_8_ = vH[1] << 0x10;
            auVar76._14_2_ = 0;
            auVar94 = paddsw(auVar22,auVar76 << 0x10);
            auVar56._8_8_ = uVar114;
            auVar56._0_8_ = uVar86;
            register0x00001240 = pblendvb(stack0xffffffffffffeb78,auVar94,auVar56);
            end_query = end_query + 1;
          }
          lVar90 = vFS[1] << 0x10;
          vFM[0] = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
          vFS[1] = lVar90;
          lVar91 = vFL[1] << 0x10;
          vFS[0] = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
          vFL[1] = lVar91;
          lVar92 = vH[1] << 0x10;
          vFL[0] = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
          vH[1] = lVar92;
          auVar21._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
          auVar21._0_8_ = vF_ext[1] << 0x10;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = CONCAT62(0,uVar77);
          register0x00001200 = paddsw(auVar21,auVar20);
          local_b88 = (short)vF_ext[1];
          sStack_b86 = vF_ext[1]._2_2_;
          sStack_b84 = vF_ext[1]._4_2_;
          sStack_b82 = vF_ext[1]._6_2_;
          sStack_b80 = (short)vF_ext[2];
          sStack_b7e = vF_ext[2]._2_2_;
          sStack_b7c = vF_ext[2]._4_2_;
          sStack_b7a = vF_ext[2]._6_2_;
          sStack_b96 = (short)vHtM[1];
          sStack_b94 = (short)((ulong)vHtM[1] >> 0x10);
          sStack_b92 = (short)((ulong)vHtM[1] >> 0x20);
          sStack_b90 = (short)((ulong)vHtM[1] >> 0x30);
          sStack_b8e = (short)vHt[0];
          sStack_b8c = (short)((ulong)vHt[0] >> 0x10);
          sStack_b8a = (short)((ulong)vHt[0] >> 0x20);
          case2[1]._0_4_ = CONCAT22(-(ushort)(sStack_b96 < sStack_b86),-(ushort)(0 < local_b88));
          case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_b94 < sStack_b84),(undefined4)case2[1]);
          case2[1] = CONCAT26(-(ushort)(sStack_b92 < sStack_b82),(undefined6)case2[1]);
          case1[0]._0_4_ =
               CONCAT22(-(ushort)(sStack_b8e < sStack_b7e),-(ushort)(sStack_b90 < sStack_b80));
          case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_b8c < sStack_b7c),(undefined4)case1[0]);
          case1[0] = CONCAT26(-(ushort)(sStack_b8a < sStack_b7a),(undefined6)case1[0]);
          vHM[1]._0_4_ = CONCAT22((ushort)(sStack_b86 < sStack_b96) * sStack_b96 |
                                  (ushort)(sStack_b86 >= sStack_b96) * sStack_b86,
                                  (ushort)(-1 < local_b88) * local_b88);
          vHM[1]._0_6_ = CONCAT24((ushort)(sStack_b84 < sStack_b94) * sStack_b94 |
                                  (ushort)(sStack_b84 >= sStack_b94) * sStack_b84,(undefined4)vHM[1]
                                 );
          vHM[1] = CONCAT26((ushort)(sStack_b82 < sStack_b92) * sStack_b92 |
                            (ushort)(sStack_b82 >= sStack_b92) * sStack_b82,(undefined6)vHM[1]);
          vH[0]._0_4_ = CONCAT22((ushort)(sStack_b7e < sStack_b8e) * sStack_b8e |
                                 (ushort)(sStack_b7e >= sStack_b8e) * sStack_b7e,
                                 (ushort)(sStack_b80 < sStack_b90) * sStack_b90 |
                                 (ushort)(sStack_b80 >= sStack_b90) * sStack_b80);
          vH[0]._0_6_ = CONCAT24((ushort)(sStack_b7c < sStack_b8c) * sStack_b8c |
                                 (ushort)(sStack_b7c >= sStack_b8c) * sStack_b7c,(undefined4)vH[0]);
          vH[0] = CONCAT26((ushort)(sStack_b7a < sStack_b8a) * sStack_b8a |
                           (ushort)(sStack_b7a >= sStack_b8a) * sStack_b7a,(undefined6)vH[0]);
          auVar55._8_8_ = vHtM[0];
          auVar55._0_8_ = lVar87;
          auVar54._8_8_ = vFM[0];
          auVar54._0_8_ = lVar90;
          auVar53._8_8_ = case1[0];
          auVar53._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar55,auVar54,auVar53);
          auVar52._8_8_ = vHtS[0];
          auVar52._0_8_ = lVar88;
          auVar51._8_8_ = vFS[0];
          auVar51._0_8_ = lVar91;
          auVar50._8_8_ = case1[0];
          auVar50._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar52,auVar51,auVar50);
          auVar49._8_8_ = vHtL[0];
          auVar49._0_8_ = lVar89;
          auVar48._8_8_ = vFL[0];
          auVar48._0_8_ = lVar92;
          auVar47._8_8_ = case1[0];
          auVar47._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar49,auVar48,auVar47);
          end_query = 0;
          while( true ) {
            local_bd8 = (short)vMaxM[1];
            sStack_bd6 = (short)((ulong)vMaxM[1] >> 0x10);
            sStack_bd4 = (short)((ulong)vMaxM[1] >> 0x20);
            sStack_bd2 = (short)((ulong)vMaxM[1] >> 0x30);
            sStack_bd0 = (short)vMaxH[0];
            sStack_bce = (short)((ulong)vMaxH[0] >> 0x10);
            sStack_bcc = (short)((ulong)vMaxH[0] >> 0x20);
            sStack_bca = (short)((ulong)vMaxH[0] >> 0x30);
            if (iVar80 <= end_query) break;
            lVar14 = b_03[end_query][0];
            lVar15 = b_03[end_query][1];
            lVar16 = b[end_query][0];
            lVar17 = b[end_query][1];
            auVar29._8_8_ = vH[0];
            auVar29._0_8_ = vHM[1];
            auVar28._8_8_ = uVar10;
            auVar28._0_8_ = uVar7;
            auVar94 = psubsw(auVar29,auVar28);
            auVar27._8_8_ = uVar11;
            auVar27._0_8_ = uVar8;
            auVar95 = psubsw(stack0xffffffffffffebc8,auVar27);
            local_9c8 = auVar94._0_2_;
            sStack_9c6 = auVar94._2_2_;
            sStack_9c4 = auVar94._4_2_;
            sStack_9c2 = auVar94._6_2_;
            sStack_9c0 = auVar94._8_2_;
            sStack_9be = auVar94._10_2_;
            sStack_9bc = auVar94._12_2_;
            sStack_9ba = auVar94._14_2_;
            local_9d8 = auVar95._0_2_;
            sStack_9d6 = auVar95._2_2_;
            sStack_9d4 = auVar95._4_2_;
            sStack_9d2 = auVar95._6_2_;
            sStack_9d0 = auVar95._8_2_;
            sStack_9ce = auVar95._10_2_;
            sStack_9cc = auVar95._12_2_;
            sStack_9ca = auVar95._14_2_;
            uVar84 = (ushort)(local_9c8 < local_9d8) * local_9d8 |
                     (ushort)(local_9c8 >= local_9d8) * local_9c8;
            uVar100 = (ushort)(sStack_9c6 < sStack_9d6) * sStack_9d6 |
                      (ushort)(sStack_9c6 >= sStack_9d6) * sStack_9c6;
            uVar104 = (ushort)(sStack_9c4 < sStack_9d4) * sStack_9d4 |
                      (ushort)(sStack_9c4 >= sStack_9d4) * sStack_9c4;
            uVar108 = (ushort)(sStack_9c2 < sStack_9d2) * sStack_9d2 |
                      (ushort)(sStack_9c2 >= sStack_9d2) * sStack_9c2;
            vF[0]._0_2_ = (ushort)(sStack_9c0 < sStack_9d0) * sStack_9d0 |
                          (ushort)(sStack_9c0 >= sStack_9d0) * sStack_9c0;
            vF[0]._2_2_ = (ushort)(sStack_9be < sStack_9ce) * sStack_9ce |
                          (ushort)(sStack_9be >= sStack_9ce) * sStack_9be;
            vF[0]._4_2_ = (ushort)(sStack_9bc < sStack_9cc) * sStack_9cc |
                          (ushort)(sStack_9bc >= sStack_9cc) * sStack_9bc;
            vF[0]._6_2_ = (ushort)(sStack_9ba < sStack_9ca) * sStack_9ca |
                          (ushort)(sStack_9ba >= sStack_9ca) * sStack_9ba;
            vF_ext[1]._0_4_ = CONCAT22(uVar100,uVar84);
            vF_ext[1]._0_6_ = CONCAT24(uVar104,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26(uVar108,(undefined6)vF_ext[1]);
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_9d6 < sStack_9c6),-(ushort)(local_9d8 < local_9c8));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_9d4 < sStack_9c4),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_9d2 < sStack_9c2),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_9ce < sStack_9be),-(ushort)(sStack_9d0 < sStack_9c0));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_9cc < sStack_9bc),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_9ca < sStack_9ba),(undefined6)case1[0]);
            auVar46._8_8_ = case1[0];
            auVar46._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffeb98,stack0xffffffffffffeb58,auVar46);
            auVar45._8_8_ = case1[0];
            auVar45._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffeb88,stack0xffffffffffffeb48,auVar45);
            auVar44._8_8_ = case1[0];
            auVar44._0_8_ = case2[1];
            auVar94 = pblendvb(stack0xffffffffffffeb78,stack0xffffffffffffeb38,auVar44);
            auVar19._8_8_ = 0x1000100010001;
            auVar19._0_8_ = 0x1000100010001;
            register0x00001200 = paddsw(auVar94,auVar19);
            local_9e8 = (ushort)lVar14;
            uStack_9e6 = (ushort)((ulong)lVar14 >> 0x10);
            uStack_9e4 = (ushort)((ulong)lVar14 >> 0x20);
            uStack_9e2 = (ushort)((ulong)lVar14 >> 0x30);
            uStack_9e0 = (ushort)lVar15;
            uStack_9de = (ushort)((ulong)lVar15 >> 0x10);
            uStack_9dc = (ushort)((ulong)lVar15 >> 0x20);
            uStack_9da = (ushort)((ulong)lVar15 >> 0x30);
            local_9f8 = (short)lVar16;
            sStack_9f6 = (short)((ulong)lVar16 >> 0x10);
            sStack_9f4 = (short)((ulong)lVar16 >> 0x20);
            sStack_9f2 = (short)((ulong)lVar16 >> 0x30);
            sStack_9f0 = (short)lVar17;
            sStack_9ee = (short)((ulong)lVar17 >> 0x10);
            sStack_9ec = (short)((ulong)lVar17 >> 0x20);
            sStack_9ea = (short)((ulong)lVar17 >> 0x30);
            uVar83 = (ushort)((short)local_9e8 < local_9f8) * local_9f8 |
                     ((short)local_9e8 >= local_9f8) * local_9e8;
            uVar103 = (ushort)((short)uStack_9e6 < sStack_9f6) * sStack_9f6 |
                      ((short)uStack_9e6 >= sStack_9f6) * uStack_9e6;
            uVar107 = (ushort)((short)uStack_9e4 < sStack_9f4) * sStack_9f4 |
                      ((short)uStack_9e4 >= sStack_9f4) * uStack_9e4;
            uVar111 = (ushort)((short)uStack_9e2 < sStack_9f2) * sStack_9f2 |
                      ((short)uStack_9e2 >= sStack_9f2) * uStack_9e2;
            uVar115 = (ushort)((short)uStack_9e0 < sStack_9f0) * sStack_9f0 |
                      ((short)uStack_9e0 >= sStack_9f0) * uStack_9e0;
            uVar119 = (ushort)((short)uStack_9de < sStack_9ee) * sStack_9ee |
                      ((short)uStack_9de >= sStack_9ee) * uStack_9de;
            uVar123 = (ushort)((short)uStack_9dc < sStack_9ec) * sStack_9ec |
                      ((short)uStack_9dc >= sStack_9ec) * uStack_9dc;
            uVar124 = (ushort)((short)uStack_9da < sStack_9ea) * sStack_9ea |
                      ((short)uStack_9da >= sStack_9ea) * uStack_9da;
            uVar99 = ((short)uVar83 < (short)uVar84) * uVar84 |
                     ((short)uVar83 >= (short)uVar84) * uVar83;
            uVar83 = ((short)uVar103 < (short)uVar100) * uVar100 |
                     ((short)uVar103 >= (short)uVar100) * uVar103;
            uVar103 = ((short)uVar107 < (short)uVar104) * uVar104 |
                      ((short)uVar107 >= (short)uVar104) * uVar107;
            uVar107 = ((short)uVar111 < (short)uVar108) * uVar108 |
                      ((short)uVar111 >= (short)uVar108) * uVar111;
            uVar111 = ((short)uVar115 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                      ((short)uVar115 >= (short)(ushort)vF[0]) * uVar115;
            uVar115 = ((short)uVar119 < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                      ((short)uVar119 >= (short)vF[0]._2_2_) * uVar119;
            uVar119 = ((short)uVar123 < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                      ((short)uVar123 >= (short)vF[0]._4_2_) * uVar123;
            uVar123 = ((short)uVar124 < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                      ((short)uVar124 >= (short)vF[0]._6_2_) * uVar124;
            uVar99 = (-1 < (short)uVar99) * uVar99;
            uVar83 = (-1 < (short)uVar83) * uVar83;
            uVar103 = (-1 < (short)uVar103) * uVar103;
            uVar107 = (-1 < (short)uVar107) * uVar107;
            uVar111 = (-1 < (short)uVar111) * uVar111;
            uVar115 = (-1 < (short)uVar115) * uVar115;
            uVar119 = (-1 < (short)uVar119) * uVar119;
            uVar123 = (-1 < (short)uVar123) * uVar123;
            vHM[1]._0_4_ = CONCAT22(uVar83,uVar99);
            vHM[1]._0_6_ = CONCAT24(uVar103,(undefined4)vHM[1]);
            vHM[1] = CONCAT26(uVar107,(undefined6)vHM[1]);
            vH[0]._0_4_ = CONCAT22(uVar115,uVar111);
            vH[0]._0_6_ = CONCAT24(uVar119,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar123,(undefined6)vH[0]);
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(uVar83 == uStack_9e6),-(ushort)(uVar99 == local_9e8));
            case2[1]._0_6_ = CONCAT24(-(ushort)(uVar103 == uStack_9e4),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(uVar107 == uStack_9e2),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(uVar115 == uStack_9de),-(ushort)(uVar111 == uStack_9e0));
            case1[0]._0_6_ = CONCAT24(-(ushort)(uVar119 == uStack_9dc),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(uVar123 == uStack_9da),(undefined6)case1[0]);
            sVar79 = -(ushort)(uVar99 == uVar84);
            sVar101 = -(ushort)(uVar83 == uVar100);
            sVar105 = -(ushort)(uVar103 == uVar104);
            sVar109 = -(ushort)(uVar107 == uVar108);
            sVar112 = -(ushort)(uVar111 == (ushort)vF[0]);
            sVar116 = -(ushort)(uVar115 == vF[0]._2_2_);
            sVar120 = -(ushort)(uVar119 == vF[0]._4_2_);
            sVar125 = -(ushort)(uVar123 == vF[0]._6_2_);
            sVar85 = -(ushort)(uVar99 == 0);
            sVar102 = -(ushort)(uVar83 == 0);
            sVar106 = -(ushort)(uVar103 == 0);
            sVar110 = -(ushort)(uVar107 == 0);
            sVar113 = -(ushort)(uVar111 == 0);
            sVar117 = -(ushort)(uVar115 == 0);
            sVar121 = -(ushort)(uVar119 == 0);
            sVar126 = -(ushort)(uVar123 == 0);
            auVar43._2_2_ = sVar101;
            auVar43._0_2_ = sVar79;
            auVar43._4_2_ = sVar105;
            auVar43._6_2_ = sVar109;
            auVar43._10_2_ = sVar116;
            auVar43._8_2_ = sVar112;
            auVar43._12_2_ = sVar120;
            auVar43._14_2_ = sVar125;
            auVar94 = pblendvb((undefined1  [16])b_00[end_query],register0x00001240,auVar43);
            auVar42._8_8_ = case1[0];
            auVar42._0_8_ = case2[1];
            auVar94 = pblendvb(auVar94,(undefined1  [16])b_04[end_query],auVar42);
            auVar41._2_2_ = sVar102;
            auVar41._0_2_ = sVar85;
            auVar41._4_2_ = sVar106;
            auVar41._6_2_ = sVar110;
            auVar41._10_2_ = sVar117;
            auVar41._8_2_ = sVar113;
            auVar41._12_2_ = sVar121;
            auVar41._14_2_ = sVar126;
            register0x00001240 = pblendvb(auVar94,ZEXT816(0),auVar41);
            auVar40._2_2_ = sVar101;
            auVar40._0_2_ = sVar79;
            auVar40._4_2_ = sVar105;
            auVar40._6_2_ = sVar109;
            auVar40._10_2_ = sVar116;
            auVar40._8_2_ = sVar112;
            auVar40._12_2_ = sVar120;
            auVar40._14_2_ = sVar125;
            auVar94 = pblendvb((undefined1  [16])b_01[end_query],register0x00001240,auVar40);
            auVar39._8_8_ = case1[0];
            auVar39._0_8_ = case2[1];
            auVar94 = pblendvb(auVar94,(undefined1  [16])b_05[end_query],auVar39);
            auVar38._2_2_ = sVar102;
            auVar38._0_2_ = sVar85;
            auVar38._4_2_ = sVar106;
            auVar38._6_2_ = sVar110;
            auVar38._10_2_ = sVar117;
            auVar38._8_2_ = sVar113;
            auVar38._12_2_ = sVar121;
            auVar38._14_2_ = sVar126;
            register0x00001240 = pblendvb(auVar94,ZEXT816(0),auVar38);
            auVar37._2_2_ = sVar101;
            auVar37._0_2_ = sVar79;
            auVar37._4_2_ = sVar105;
            auVar37._6_2_ = sVar109;
            auVar37._10_2_ = sVar116;
            auVar37._8_2_ = sVar112;
            auVar37._12_2_ = sVar120;
            auVar37._14_2_ = sVar125;
            auVar94 = pblendvb((undefined1  [16])b_02[end_query],register0x00001200,auVar37);
            auVar36._8_8_ = case1[0];
            auVar36._0_8_ = case2[1];
            auVar94 = pblendvb(auVar94,(undefined1  [16])b_06[end_query],auVar36);
            auVar35._2_2_ = sVar102;
            auVar35._0_2_ = sVar85;
            auVar35._4_2_ = sVar106;
            auVar35._6_2_ = sVar110;
            auVar35._10_2_ = sVar117;
            auVar35._8_2_ = sVar113;
            auVar35._12_2_ = sVar121;
            auVar35._14_2_ = sVar126;
            register0x00001240 = pblendvb(auVar94,ZEXT816(0),auVar35);
            b_03[end_query][0] = vHM[1];
            b_03[end_query][1] = vH[0];
            b_04[end_query][0] = vHS[1];
            b_04[end_query][1] = vHM[0];
            b_05[end_query][0] = vHL[1];
            b_05[end_query][1] = vHS[0];
            b_06[end_query][0] = vHp[1];
            b_06[end_query][1] = vHL[0];
            local_178 = (short)vSaturationCheckMax[1];
            sStack_176 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_174 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_172 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_170 = (short)vSaturationCheckMin[0];
            sStack_16e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_16c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_16a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar107 < sStack_172) * uVar107 |
                          (ushort)((short)uVar107 >= sStack_172) * sStack_172,
                          CONCAT24(((short)uVar103 < sStack_174) * uVar103 |
                                   (ushort)((short)uVar103 >= sStack_174) * sStack_174,
                                   CONCAT22(((short)uVar83 < sStack_176) * uVar83 |
                                            (ushort)((short)uVar83 >= sStack_176) * sStack_176,
                                            ((short)uVar99 < local_178) * uVar99 |
                                            (ushort)((short)uVar99 >= local_178) * local_178)));
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar123 < sStack_16a) * uVar123 |
                          (ushort)((short)uVar123 >= sStack_16a) * sStack_16a,
                          CONCAT24(((short)uVar119 < sStack_16c) * uVar119 |
                                   (ushort)((short)uVar119 >= sStack_16c) * sStack_16c,
                                   CONCAT22(((short)uVar115 < sStack_16e) * uVar115 |
                                            (ushort)((short)uVar115 >= sStack_16e) * sStack_16e,
                                            ((short)uVar111 < sStack_170) * uVar111 |
                                            (ushort)((short)uVar111 >= sStack_170) * sStack_170)));
            local_a48 = (short)vMaxH[1];
            sStack_a46 = (short)((ulong)vMaxH[1] >> 0x10);
            sStack_a44 = (short)((ulong)vMaxH[1] >> 0x20);
            sStack_a42 = (short)((ulong)vMaxH[1] >> 0x30);
            sStack_a40 = (short)vSaturationCheckMax[0];
            sStack_a3e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_a3c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_a3a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            uVar84 = (local_a48 < (short)uVar99) * uVar99 |
                     (ushort)(local_a48 >= (short)uVar99) * local_a48;
            uVar100 = (sStack_a46 < (short)uVar83) * uVar83 |
                      (ushort)(sStack_a46 >= (short)uVar83) * sStack_a46;
            uVar104 = (sStack_a44 < (short)uVar103) * uVar103 |
                      (ushort)(sStack_a44 >= (short)uVar103) * sStack_a44;
            uVar108 = (sStack_a42 < (short)uVar107) * uVar107 |
                      (ushort)(sStack_a42 >= (short)uVar107) * sStack_a42;
            uVar124 = (sStack_a40 < (short)uVar111) * uVar111 |
                      (ushort)(sStack_a40 >= (short)uVar111) * sStack_a40;
            uVar118 = (sStack_a3e < (short)uVar115) * uVar115 |
                      (ushort)(sStack_a3e >= (short)uVar115) * sStack_a3e;
            uVar122 = (sStack_a3c < (short)uVar119) * uVar119 |
                      (ushort)(sStack_a3c >= (short)uVar119) * sStack_a3c;
            uVar127 = (sStack_a3a < (short)uVar123) * uVar123 |
                      (ushort)(sStack_a3a >= (short)uVar123) * sStack_a3a;
            local_a78 = (short)vHS[1];
            sStack_a76 = vHS[1]._2_2_;
            sStack_a74 = vHS[1]._4_2_;
            sStack_a72 = vHS[1]._6_2_;
            sStack_a70 = (short)vHS[2];
            sStack_a6e = vHS[2]._2_2_;
            sStack_a6c = vHS[2]._4_2_;
            sStack_a6a = vHS[2]._6_2_;
            uVar84 = (ushort)((short)uVar84 < local_a78) * local_a78 |
                     ((short)uVar84 >= local_a78) * uVar84;
            uVar100 = (ushort)((short)uVar100 < sStack_a76) * sStack_a76 |
                      ((short)uVar100 >= sStack_a76) * uVar100;
            uVar104 = (ushort)((short)uVar104 < sStack_a74) * sStack_a74 |
                      ((short)uVar104 >= sStack_a74) * uVar104;
            uVar108 = (ushort)((short)uVar108 < sStack_a72) * sStack_a72 |
                      ((short)uVar108 >= sStack_a72) * uVar108;
            uVar124 = (ushort)((short)uVar124 < sStack_a70) * sStack_a70 |
                      ((short)uVar124 >= sStack_a70) * uVar124;
            uVar118 = (ushort)((short)uVar118 < sStack_a6e) * sStack_a6e |
                      ((short)uVar118 >= sStack_a6e) * uVar118;
            uVar122 = (ushort)((short)uVar122 < sStack_a6c) * sStack_a6c |
                      ((short)uVar122 >= sStack_a6c) * uVar122;
            uVar127 = (ushort)((short)uVar127 < sStack_a6a) * sStack_a6a |
                      ((short)uVar127 >= sStack_a6a) * uVar127;
            local_a98 = (short)vHL[1];
            sStack_a96 = vHL[1]._2_2_;
            sStack_a94 = vHL[1]._4_2_;
            sStack_a92 = vHL[1]._6_2_;
            sStack_a90 = (short)vHL[2];
            sStack_a8e = vHL[2]._2_2_;
            sStack_a8c = vHL[2]._4_2_;
            sStack_a8a = vHL[2]._6_2_;
            uVar84 = (ushort)((short)uVar84 < local_a98) * local_a98 |
                     ((short)uVar84 >= local_a98) * uVar84;
            uVar100 = (ushort)((short)uVar100 < sStack_a96) * sStack_a96 |
                      ((short)uVar100 >= sStack_a96) * uVar100;
            uVar104 = (ushort)((short)uVar104 < sStack_a94) * sStack_a94 |
                      ((short)uVar104 >= sStack_a94) * uVar104;
            uVar108 = (ushort)((short)uVar108 < sStack_a92) * sStack_a92 |
                      ((short)uVar108 >= sStack_a92) * uVar108;
            uVar124 = (ushort)((short)uVar124 < sStack_a90) * sStack_a90 |
                      ((short)uVar124 >= sStack_a90) * uVar124;
            uVar118 = (ushort)((short)uVar118 < sStack_a8e) * sStack_a8e |
                      ((short)uVar118 >= sStack_a8e) * uVar118;
            uVar122 = (ushort)((short)uVar122 < sStack_a8c) * sStack_a8c |
                      ((short)uVar122 >= sStack_a8c) * uVar122;
            uVar127 = (ushort)((short)uVar127 < sStack_a8a) * sStack_a8a |
                      ((short)uVar127 >= sStack_a8a) * uVar127;
            local_ab8 = (short)vHp[1];
            sStack_ab6 = vHp[1]._2_2_;
            sStack_ab4 = vHp[1]._4_2_;
            sStack_ab2 = vHp[1]._6_2_;
            sStack_ab0 = (short)vHp[2];
            sStack_aae = vHp[2]._2_2_;
            sStack_aac = vHp[2]._4_2_;
            sStack_aaa = vHp[2]._6_2_;
            vMaxH[1] = CONCAT26((ushort)((short)uVar108 < sStack_ab2) * sStack_ab2 |
                                ((short)uVar108 >= sStack_ab2) * uVar108,
                                CONCAT24((ushort)((short)uVar104 < sStack_ab4) * sStack_ab4 |
                                         ((short)uVar104 >= sStack_ab4) * uVar104,
                                         CONCAT22((ushort)((short)uVar100 < sStack_ab6) * sStack_ab6
                                                  | ((short)uVar100 >= sStack_ab6) * uVar100,
                                                  (ushort)((short)uVar84 < local_ab8) * local_ab8 |
                                                  ((short)uVar84 >= local_ab8) * uVar84)));
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)((short)uVar127 < sStack_aaa) * sStack_aaa |
                          ((short)uVar127 >= sStack_aaa) * uVar127,
                          CONCAT24((ushort)((short)uVar122 < sStack_aac) * sStack_aac |
                                   ((short)uVar122 >= sStack_aac) * uVar122,
                                   CONCAT22((ushort)((short)uVar118 < sStack_aae) * sStack_aae |
                                            ((short)uVar118 >= sStack_aae) * uVar118,
                                            (ushort)((short)uVar124 < sStack_ab0) * sStack_ab0 |
                                            ((short)uVar124 >= sStack_ab0) * uVar124)));
            vH_00[0] = (ulong)(uint)end_query;
            vH_00[1]._0_4_ = iVar80;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                             &profile_local->matrix)->trace->trace_del_table,vH_00,end_ref,s2Len,
                            in_R9D,in_stack_ffffffffffffe9a8);
            vH_01[0] = (ulong)(uint)end_query;
            vH_01[1]._0_4_ = iVar80;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 8),
                            vH_01,end_ref,s2Len,in_R9D,in_stack_ffffffffffffe9a8);
            vH_02[0] = (ulong)(uint)end_query;
            vH_02[1]._0_4_ = iVar80;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x10),
                            vH_02,end_ref,s2Len,in_R9D,in_stack_ffffffffffffe9a8);
            array = *(__m128i **)
                     ((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix
                            )->trace->trace_del_table + 0x18);
            vH_03[0] = (ulong)(uint)end_query;
            vH_03[1]._0_4_ = iVar80;
            vH_03[1]._4_4_ = 0;
            arr_store_si128((int *)array,vH_03,end_ref,s2Len,in_R9D,in_stack_ffffffffffffe9a8);
            sVar79 = -(ushort)(local_bd8 < (short)uVar99);
            sVar85 = -(ushort)(sStack_bd6 < (short)uVar83);
            sVar101 = -(ushort)(sStack_bd4 < (short)uVar103);
            sVar102 = -(ushort)(sStack_bd2 < (short)uVar107);
            sVar105 = -(ushort)(sStack_bd0 < (short)uVar111);
            sVar106 = -(ushort)(sStack_bce < (short)uVar115);
            sVar109 = -(ushort)(sStack_bcc < (short)uVar119);
            sVar110 = -(ushort)(sStack_bca < (short)uVar123);
            vMaxM[1] = CONCAT26((ushort)((short)uVar107 < sStack_bd2) * sStack_bd2 |
                                ((short)uVar107 >= sStack_bd2) * uVar107,
                                CONCAT24((ushort)((short)uVar103 < sStack_bd4) * sStack_bd4 |
                                         ((short)uVar103 >= sStack_bd4) * uVar103,
                                         CONCAT22((ushort)((short)uVar83 < sStack_bd6) * sStack_bd6
                                                  | ((short)uVar83 >= sStack_bd6) * uVar83,
                                                  (ushort)((short)uVar99 < local_bd8) * local_bd8 |
                                                  ((short)uVar99 >= local_bd8) * uVar99)));
            vMaxH[0] = CONCAT26((ushort)((short)uVar123 < sStack_bca) * sStack_bca |
                                ((short)uVar123 >= sStack_bca) * uVar123,
                                CONCAT24((ushort)((short)uVar119 < sStack_bcc) * sStack_bcc |
                                         ((short)uVar119 >= sStack_bcc) * uVar119,
                                         CONCAT22((ushort)((short)uVar115 < sStack_bce) * sStack_bce
                                                  | ((short)uVar115 >= sStack_bce) * uVar115,
                                                  (ushort)((short)uVar111 < sStack_bd0) * sStack_bd0
                                                  | ((short)uVar111 >= sStack_bd0) * uVar111)));
            auVar34._2_2_ = sVar85;
            auVar34._0_2_ = sVar79;
            auVar34._4_2_ = sVar101;
            auVar34._6_2_ = sVar102;
            auVar34._10_2_ = sVar106;
            auVar34._8_2_ = sVar105;
            auVar34._12_2_ = sVar109;
            auVar34._14_2_ = sVar110;
            register0x00001240 = pblendvb(stack0xffffffffffffed08,register0x00001240,auVar34);
            auVar33._2_2_ = sVar85;
            auVar33._0_2_ = sVar79;
            auVar33._4_2_ = sVar101;
            auVar33._6_2_ = sVar102;
            auVar33._10_2_ = sVar106;
            auVar33._8_2_ = sVar105;
            auVar33._12_2_ = sVar109;
            auVar33._14_2_ = sVar110;
            register0x00001240 = pblendvb(stack0xffffffffffffecf8,register0x00001240,auVar33);
            auVar32._2_2_ = sVar85;
            auVar32._0_2_ = sVar79;
            auVar32._4_2_ = sVar101;
            auVar32._6_2_ = sVar102;
            auVar32._10_2_ = sVar106;
            auVar32._8_2_ = sVar105;
            auVar32._12_2_ = sVar109;
            auVar32._14_2_ = sVar110;
            register0x00001240 = pblendvb(stack0xffffffffffffece8,register0x00001240,auVar32);
            end_query = end_query + 1;
          }
          local_bf8 = (short)vNegInfFront[1];
          sStack_bf6 = (short)((ulong)vNegInfFront[1] >> 0x10);
          sStack_bf4 = (short)((ulong)vNegInfFront[1] >> 0x20);
          sStack_bf2 = (short)((ulong)vNegInfFront[1] >> 0x30);
          sStack_bf0 = (short)vMaxHUnit[0];
          sStack_bee = (short)((ulong)vMaxHUnit[0] >> 0x10);
          sStack_bec = (short)((ulong)vMaxHUnit[0] >> 0x20);
          sStack_bea = (short)((ulong)vMaxHUnit[0] >> 0x30);
          uVar83 = -(ushort)(sStack_bf0 < sStack_bd0);
          uVar99 = -(ushort)(sStack_bee < sStack_bce);
          uVar103 = -(ushort)(sStack_bea < sStack_bca);
          auVar75._2_2_ = -(ushort)(sStack_bf6 < sStack_bd6);
          auVar75._0_2_ = -(ushort)(local_bf8 < local_bd8);
          auVar75._4_2_ = -(ushort)(sStack_bf4 < sStack_bd4);
          auVar75._6_2_ = -(ushort)(sStack_bf2 < sStack_bd2);
          iVar18 = CONCAT24(-(ushort)(sStack_bec < sStack_bcc),CONCAT22(uVar99,uVar83));
          auVar75._14_2_ = uVar103;
          auVar75._8_6_ = iVar18;
          if ((((((((((((((((auVar75 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar75 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar75 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar75 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar75 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar75 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar83 & 0x80) != 0) || (uVar83 & 0x8000) != 0) || (uVar99 & 0x80) != 0) ||
                 (uVar99 & 0x8000) != 0) || (-(ushort)(sStack_bec < sStack_bcc) & 0x80) != 0) ||
               iVar18 != 0) || (uVar103 >> 7 & 1) != 0) || sStack_bea < sStack_bca) {
            a[1] = vH_03[0];
            a[0] = (longlong)array;
            local_128a = _mm_hmax_epi16_rpl(a);
            vNegInfFront[1] =
                 CONCAT26(local_128a,CONCAT24(local_128a,CONCAT22(local_128a,local_128a)));
            vMaxHUnit[0] = CONCAT26(local_128a,CONCAT24(local_128a,CONCAT22(local_128a,local_128a)))
            ;
            matrix._4_4_ = end_ref;
            memcpy(ptr,b_03,(long)iVar80 << 4);
            memcpy(ptr_00,b_04,(long)iVar80 << 4);
            memcpy(ptr_01,b_05,(long)iVar80 << 4);
            array = ptr_02;
            memcpy(ptr_02,b_06,(long)iVar80 << 4);
          }
        }
        _temp = ptr_02;
        l = (int16_t *)ptr_01;
        s = (int16_t *)ptr_00;
        m = (int16_t *)ptr;
        for (end_query = 0; end_query < iVar80 * 8; end_query = end_query + 1) {
          if ((*m == local_128a) &&
             (iVar81 = end_query / 8 + (end_query % 8) * iVar80, iVar81 < s1Len)) {
            local_128c = *s;
            local_128e = *l;
            local_1290 = (short)(*_temp)[0];
            s1Len = iVar81;
          }
          m = m + 1;
          s = s + 1;
          l = l + 1;
          _temp = (__m128i *)((long)*_temp + 2);
        }
        local_128 = (short)vSaturationCheckMax[1];
        sStack_126 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_124 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_122 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_120 = (short)vSaturationCheckMin[0];
        sStack_11e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_11c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_11a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_c08 = (short)vMaxH[1];
        sStack_c06 = (short)((ulong)vMaxH[1] >> 0x10);
        sStack_c04 = (short)((ulong)vMaxH[1] >> 0x20);
        sStack_c02 = (short)((ulong)vMaxH[1] >> 0x30);
        sStack_c00 = (short)vSaturationCheckMax[0];
        sStack_bfe = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_bfc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_bfa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        vH_03[0] = CONCAT26(-(ushort)(sStack_11a < (short)uVar77),
                            CONCAT24(-(ushort)(sStack_11c < (short)uVar77),
                                     CONCAT22(-(ushort)(sStack_11e < (short)uVar77),
                                              -(ushort)(sStack_120 < (short)uVar77)))) |
                   CONCAT26(-(ushort)(sVar78 < sStack_bfa),
                            CONCAT24(-(ushort)(sVar78 < sStack_bfc),
                                     CONCAT22(-(ushort)(sVar78 < sStack_bfe),
                                              -(ushort)(sVar78 < sStack_c00))));
        auVar74._8_8_ = vH_03[0];
        auVar74._0_8_ =
             CONCAT26(-(ushort)(sStack_122 < (short)uVar77),
                      CONCAT24(-(ushort)(sStack_124 < (short)uVar77),
                               CONCAT22(-(ushort)(sStack_126 < (short)uVar77),
                                        -(ushort)(local_128 < (short)uVar77)))) |
             CONCAT26(-(ushort)(sVar78 < sStack_c02),
                      CONCAT24(-(ushort)(sVar78 < sStack_c04),
                               CONCAT22(-(ushort)(sVar78 < sStack_c06),-(ushort)(sVar78 < local_c08)
                                       )));
        if ((((((((((((((((auVar74 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar74 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar74 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar74 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar74 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar74 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (vH_03[0] >> 7 & 1) != 0) || (vH_03[0] >> 0xf & 1) != 0) ||
                (vH_03[0] >> 0x17 & 1) != 0) || (vH_03[0] >> 0x1f & 1) != 0) ||
              (vH_03[0] >> 0x27 & 1) != 0) || (vH_03[0] >> 0x2f & 1) != 0) ||
            (vH_03[0] >> 0x37 & 1) != 0) || (long)vH_03[0] < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_128a = 0;
          local_128c = 0;
          local_128e = 0;
          local_1290 = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)(short)local_128a;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = matrix._4_4_;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->extra =
             (int)local_128c;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)local_128e;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)local_1290;
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(b_06);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            vH = _mm_max_epi16(vH, vZero);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            case0 = _mm_cmpeq_epi16(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}